

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::TimeZoneFormat::formatExemplarLocation
          (TimeZoneFormat *this,TimeZone *tz,UnicodeString *name)

{
  TimeZoneNames *pTVar1;
  int32_t iVar2;
  ConstChar16Ptr local_210;
  UnicodeString local_208;
  ConstChar16Ptr local_1c8;
  UnicodeString local_1c0;
  UChar *local_170;
  UChar *canonicalID;
  UnicodeString location;
  UChar locationBuf [128];
  UnicodeString *name_local;
  TimeZone *tz_local;
  TimeZoneFormat *this_local;
  
  UnicodeString::UnicodeString
            ((UnicodeString *)&canonicalID,location.fUnion.fStackFields.fBuffer + 0x17,0,0x80);
  local_170 = ZoneMeta::getCanonicalCLDRID(tz);
  if (local_170 != (UChar *)0x0) {
    pTVar1 = this->fTimeZoneNames;
    ConstChar16Ptr::ConstChar16Ptr(&local_1c8,local_170);
    UnicodeString::UnicodeString(&local_1c0,'\x01',&local_1c8,-1);
    (*(pTVar1->super_UObject)._vptr_UObject[0xb])(pTVar1,&local_1c0,&canonicalID);
    UnicodeString::~UnicodeString(&local_1c0);
    ConstChar16Ptr::~ConstChar16Ptr(&local_1c8);
  }
  iVar2 = UnicodeString::length((UnicodeString *)&canonicalID);
  if (iVar2 < 1) {
    pTVar1 = this->fTimeZoneNames;
    ConstChar16Ptr::ConstChar16Ptr(&local_210,(char16_t *)UNKNOWN_ZONE_ID);
    UnicodeString::UnicodeString(&local_208,'\x01',&local_210,-1);
    (*(pTVar1->super_UObject)._vptr_UObject[0xb])(pTVar1,&local_208,&canonicalID);
    UnicodeString::~UnicodeString(&local_208);
    ConstChar16Ptr::~ConstChar16Ptr(&local_210);
    iVar2 = UnicodeString::length((UnicodeString *)&canonicalID);
    if (iVar2 < 1) {
      UnicodeString::setTo(name,(char16_t *)UNKNOWN_LOCATION,-1);
    }
    else {
      UnicodeString::setTo(name,(UnicodeString *)&canonicalID);
    }
  }
  else {
    UnicodeString::setTo(name,(UnicodeString *)&canonicalID);
  }
  UnicodeString::~UnicodeString((UnicodeString *)&canonicalID);
  return name;
}

Assistant:

UnicodeString&
TimeZoneFormat::formatExemplarLocation(const TimeZone& tz, UnicodeString& name) const {
    UChar locationBuf[ZONE_NAME_U16_MAX];
    UnicodeString location(locationBuf, 0, UPRV_LENGTHOF(locationBuf));
    const UChar* canonicalID = ZoneMeta::getCanonicalCLDRID(tz);

    if (canonicalID) {
        fTimeZoneNames->getExemplarLocationName(UnicodeString(TRUE, canonicalID, -1), location);
    }
    if (location.length() > 0) {
        name.setTo(location);
    } else {
        // Use "unknown" location
        fTimeZoneNames->getExemplarLocationName(UnicodeString(TRUE, UNKNOWN_ZONE_ID, -1), location);
        if (location.length() > 0) {
            name.setTo(location);
        } else {
            // last resort
            name.setTo(UNKNOWN_LOCATION, -1);
        }
    }
    return name;
}